

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

Status __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::dualRowStatus(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int i)

{
  type_conflict5 tVar1;
  bool bVar2;
  cpp_dec_float<200U,_int,_void> *this_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  ulong *puVar4;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffdd0;
  double in_stack_fffffffffffffdd8;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffde0;
  ulong local_208;
  undefined1 local_200 [128];
  ulong local_180;
  undefined1 local_174 [128];
  undefined1 local_f4 [144];
  Status local_64;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  ulong *local_40;
  undefined1 *local_38;
  undefined8 local_30;
  ulong *local_28;
  undefined1 *local_20;
  ulong *local_18;
  ulong *local_10;
  undefined8 local_8;
  
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::rhs(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
  local_58 = infinity();
  local_50 = local_f4;
  local_60 = 0;
  local_8 = local_58;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  tVar1 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x6a4c10);
  if (tVar1) {
    this_00 = &SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::lhs(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc)->m_backend;
    puVar4 = (ulong *)infinity();
    local_180 = *puVar4 ^ 0x8000000000000000;
    local_38 = local_174;
    local_40 = &local_180;
    local_48 = 0;
    local_10 = local_40;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (this_00,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x6a4cc7);
    if (tVar1) {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lhs(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::rhs(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
      bVar2 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x6a4d0c);
      if (bVar2) {
        local_64 = D_FREE;
      }
      else {
        local_64 = D_ON_BOTH;
      }
    }
    else {
      local_64 = D_ON_LOWER;
    }
  }
  else {
    pnVar3 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::lhs(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
    puVar4 = (ulong *)infinity();
    local_208 = *puVar4 ^ 0x8000000000000000;
    local_20 = local_200;
    local_28 = &local_208;
    local_30 = 0;
    local_18 = local_28;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,pnVar3);
    tVar1 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x6a4de4);
    if (tVar1) {
      local_64 = D_ON_UPPER;
    }
    else {
      local_64 = D_UNDEFINED;
    }
  }
  return local_64;
}

Assistant:

typename SPxBasisBase<R>::Desc::Status
SPxBasisBase<R>::dualRowStatus(int i) const
{
   assert(theLP != nullptr);

   if(theLP->rhs(i) < R(infinity))
   {
      if(theLP->lhs(i) > R(-infinity))
      {
         if(theLP->lhs(i) == theLP->rhs(i))
            return Desc::D_FREE;
         else
            return Desc::D_ON_BOTH;
      }
      else
         return Desc::D_ON_LOWER;
   }
   else if(theLP->lhs(i) > R(-infinity))
      return Desc::D_ON_UPPER;
   else
      return Desc::D_UNDEFINED;
}